

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

void bilinear_filter4xh(uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint7 uVar3;
  int in_ECX;
  longlong in_RDX;
  longlong extraout_RDX;
  undefined4 *in_RSI;
  ulong *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  undefined4 extraout_XMM0_Da;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  __m128i alVar4;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_val_w;
  __m128i res_1;
  __m128i b1_1;
  __m128i a1_1;
  __m128i b0_1;
  __m128i a0_1;
  __m128i e;
  __m128i d;
  __m128i c;
  __m128i b_3;
  __m128i a;
  __m128i vfilter_vec;
  uint8_t *vfilter;
  __m128i y;
  __m128i x_3;
  __m128i v0;
  __m128i z_1;
  __m128i x_2;
  __m128i res;
  __m128i b1;
  __m128i a1;
  __m128i b0;
  __m128i a0;
  __m128i z3;
  __m128i x3;
  __m128i z2;
  __m128i x2;
  __m128i z1;
  __m128i x1;
  __m128i z0;
  __m128i x0;
  __m128i hfilter_vec;
  uint8_t *hfilter;
  uint8_t *b_2;
  __m128i z;
  __m128i x_1;
  uint8_t *b_1;
  __m128i x;
  uint8_t *b;
  int i;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined4 local_428;
  undefined4 uStack_424;
  uint uStack_420;
  uint uStack_41c;
  undefined4 local_418;
  undefined4 uStack_414;
  uint uStack_410;
  uint uStack_40c;
  undefined1 local_408 [16];
  ulong local_3f8;
  undefined8 uStack_3f0;
  undefined1 local_3e8 [16];
  ulong local_3d8;
  undefined8 uStack_3d0;
  undefined1 local_3c8 [16];
  ulong local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  ulong local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  uint8_t (*local_378) [2];
  undefined8 *local_370;
  undefined1 local_368 [16];
  ulong local_358;
  undefined8 uStack_350;
  undefined8 *local_340;
  undefined8 *local_328;
  int local_320;
  int local_31c;
  undefined8 *local_318;
  int local_30c;
  int local_308;
  int local_304;
  ulong *local_300;
  undefined8 *local_2e0;
  undefined8 *local_2c0;
  undefined1 local_2b8;
  undefined1 uStack_2b7;
  undefined1 uStack_2b6;
  undefined1 uStack_2b5;
  undefined1 uStack_2b4;
  undefined1 uStack_2b3;
  undefined1 uStack_2b2;
  undefined1 uStack_2b1;
  undefined1 uStack_2b0;
  undefined1 uStack_2af;
  undefined1 uStack_2ae;
  undefined1 uStack_2ad;
  undefined1 uStack_2ac;
  undefined1 uStack_2ab;
  undefined1 uStack_2aa;
  undefined1 uStack_2a9;
  undefined1 local_2a8;
  undefined1 uStack_2a7;
  undefined1 uStack_2a6;
  undefined1 uStack_2a5;
  undefined1 uStack_2a4;
  undefined1 uStack_2a3;
  undefined1 uStack_2a2;
  undefined1 uStack_2a1;
  undefined1 uStack_2a0;
  undefined1 uStack_29f;
  undefined1 uStack_29e;
  undefined1 uStack_29d;
  undefined1 uStack_29c;
  undefined1 uStack_29b;
  undefined1 uStack_29a;
  undefined1 uStack_299;
  ulong local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  uint8_t local_26c [2];
  uint8_t local_26a [2];
  undefined8 local_268;
  undefined8 uStack_260;
  uint8_t local_258 [2];
  uint8_t local_256 [2];
  uint8_t local_254 [2];
  uint8_t local_252 [2];
  uint8_t local_250 [2];
  uint8_t local_24e [2];
  uint8_t local_24c [2];
  uint8_t local_24a [2];
  undefined8 local_248;
  undefined8 uStack_240;
  uint8_t local_238 [2];
  uint8_t local_236 [2];
  uint8_t local_234 [2];
  uint8_t local_232 [2];
  uint8_t local_230 [2];
  uint8_t local_22e [2];
  uint8_t local_22c [2];
  uint8_t local_22a [2];
  ulong local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  ulong uStack_1f0;
  ulong local_1c8;
  undefined8 uStack_1c0;
  ulong *local_1b0;
  ulong local_1a8;
  undefined8 uStack_1a0;
  ulong *local_190;
  ulong local_188;
  undefined8 uStack_180;
  ulong *local_170;
  ulong local_168;
  undefined8 uStack_160;
  ulong *local_150;
  ulong local_148;
  undefined8 uStack_140;
  ulong *local_130;
  ulong local_128;
  undefined8 uStack_120;
  ulong *local_110;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 local_c8;
  undefined4 uStack_c4;
  ulong local_88;
  undefined8 uStack_80;
  ulong local_78;
  undefined8 uStack_70;
  ulong local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_304 = (int)in_RSI;
  local_308 = (int)in_RDX;
  local_31c = in_R9D;
  local_318 = in_R8;
  local_30c = in_ECX;
  local_300 = in_RDI;
  if (local_308 == 0) {
    local_328 = in_R8;
    for (local_320 = 0; local_320 < local_31c + 1; local_320 = local_320 + 1) {
      alVar4 = xx_loadl_32(local_300);
      v[1] = alVar4[1];
      v[0] = (longlong)in_RSI;
      xx_storel_32(local_328,v);
      local_300 = (ulong *)((long)local_300 + (long)local_304);
      local_328 = (undefined8 *)((long)local_328 + 4);
    }
  }
  else if (local_308 == 4) {
    local_340 = in_R8;
    for (local_320 = 0; local_320 < local_31c + 1; local_320 = local_320 + 1) {
      local_110 = local_300;
      local_358 = *local_300;
      uStack_120 = 0;
      uStack_350 = 0;
      local_298 = local_358 >> 8;
      local_368._8_8_ = 0;
      local_368._0_8_ = local_298;
      uStack_280 = 0;
      uStack_290 = 0;
      local_288._0_1_ = (undefined1)local_358;
      local_288._1_1_ = (undefined1)(local_358 >> 8);
      local_288._2_1_ = (undefined1)(local_358 >> 0x10);
      local_288._3_1_ = (undefined1)(local_358 >> 0x18);
      local_288._4_1_ = (undefined1)(local_358 >> 0x20);
      local_288._5_1_ = (undefined1)(local_358 >> 0x28);
      local_288._6_1_ = (undefined1)(local_358 >> 0x30);
      local_288._7_1_ = (undefined1)(local_358 >> 0x38);
      pavgb((undefined1)local_288,local_288._1_1_);
      pavgb(local_288._1_1_,local_288._2_1_);
      pavgb(local_288._2_1_,local_288._3_1_);
      pavgb(local_288._3_1_,local_288._4_1_);
      pavgb(local_288._4_1_,local_288._5_1_);
      pavgb(local_288._5_1_,local_288._6_1_);
      pavgb(local_288._6_1_,local_288._7_1_);
      pavgb(local_288._7_1_,0);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      v_00[1] = in_RDX;
      v_00[0] = (longlong)in_RSI;
      local_288 = local_358;
      local_128 = local_358;
      xx_storel_32(local_340,v_00);
      local_300 = (ulong *)((long)local_300 + (long)local_304);
      local_340 = (undefined8 *)((long)local_340 + 4);
      in_RDX = extraout_RDX;
    }
  }
  else {
    local_378 = bilinear_filters_2t + local_308;
    local_26a = *local_378;
    local_388 = CONCAT26(local_26a,CONCAT24(local_26a,CONCAT22(local_26a,local_26a)));
    uStack_380 = CONCAT26(local_26a,CONCAT24(local_26a,CONCAT22(local_26a,local_26a)));
    local_370 = in_R8;
    local_268 = local_388;
    uStack_260 = uStack_380;
    local_258 = local_26a;
    local_256 = local_26a;
    local_254 = local_26a;
    local_252 = local_26a;
    local_250 = local_26a;
    local_24e = local_26a;
    local_24c = local_26a;
    local_24a = local_26a;
    for (local_320 = 0; local_320 < local_31c; local_320 = local_320 + 4) {
      local_130 = local_300;
      local_398 = *local_300;
      uStack_140 = 0;
      uStack_390 = 0;
      local_3a8._8_8_ = 0;
      local_3a8._0_8_ = local_398 >> 8;
      local_150 = (ulong *)((long)local_300 + (long)local_304);
      local_3b8 = *local_150;
      uStack_160 = 0;
      uStack_3b0 = 0;
      local_3c8._8_8_ = 0;
      local_3c8._0_8_ = local_3b8 >> 8;
      local_170 = (ulong *)((long)local_300 + (long)(local_304 * 2));
      local_3d8 = *local_170;
      uStack_180 = 0;
      uStack_3d0 = 0;
      local_78 = local_3d8 >> 8;
      local_3e8._8_8_ = 0;
      local_3e8._0_8_ = local_78;
      local_190 = (ulong *)((long)local_300 + (long)(local_304 * 3));
      local_3f8 = *local_190;
      uStack_1a0 = 0;
      uStack_3f0 = 0;
      local_88 = local_3f8 >> 8;
      local_408._8_8_ = 0;
      local_408._0_8_ = local_88;
      uStack_10 = 0;
      uStack_20 = 0;
      local_18._0_4_ = (undefined4)local_398;
      local_18._4_4_ = (uint)(local_398 >> 0x20);
      local_28._0_4_ = (undefined4)local_3b8;
      local_28._4_4_ = (uint)(local_3b8 >> 0x20);
      local_418 = (undefined4)local_18;
      uStack_414 = (undefined4)local_28;
      uStack_410 = local_18._4_4_;
      uStack_40c = local_28._4_4_;
      uStack_30 = 0;
      uStack_40 = 0;
      local_38._0_4_ = (undefined4)(local_398 >> 8);
      local_38._4_4_ = local_18._4_4_ >> 8;
      local_48._0_4_ = (undefined4)(local_3b8 >> 8);
      local_48._4_4_ = local_28._4_4_ >> 8;
      local_428 = (undefined4)local_38;
      uStack_424 = (undefined4)local_48;
      uStack_420 = local_38._4_4_;
      uStack_41c = local_48._4_4_;
      uStack_50 = 0;
      uStack_60 = 0;
      uStack_70 = 0;
      uStack_80 = 0;
      in_RSI = &local_428;
      local_1a8 = local_3f8;
      local_188 = local_3d8;
      local_168 = local_3b8;
      local_148 = local_398;
      local_68 = local_3f8;
      local_58 = local_3d8;
      local_48 = local_3b8 >> 8;
      local_38 = local_398 >> 8;
      local_28 = local_3b8;
      local_18 = local_398;
      alVar4 = filter_block_2rows((__m128i *)
                                  CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                                  (__m128i *)
                                  CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                                  (__m128i *)
                                  CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                                  (__m128i *)
                                  CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                                  (__m128i *)
                                  CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      in_RDX = alVar4[1];
      local_2c0 = local_370;
      *local_370 = extraout_XMM0_Qa;
      local_370[1] = extraout_XMM0_Qb;
      local_300 = (ulong *)((long)local_300 + (long)(local_304 << 2));
      local_370 = local_370 + 2;
    }
    local_1b0 = local_300;
    local_1c8 = *local_300;
    uStack_1c0 = 0;
    local_228 = local_1c8 >> 8;
    uStack_210 = 0;
    uStack_220 = 0;
    local_218._1_1_ = (undefined1)(local_1c8 >> 8);
    local_218._2_1_ = (undefined1)(local_1c8 >> 0x10);
    local_218._3_1_ = (undefined1)(local_1c8 >> 0x18);
    local_218._4_1_ = (undefined1)(local_1c8 >> 0x20);
    local_218._5_1_ = (undefined1)(local_1c8 >> 0x28);
    local_218._6_1_ = (undefined1)(local_1c8 >> 0x30);
    local_218._7_1_ = (undefined1)(local_1c8 >> 0x38);
    local_488._0_2_ = (undefined2)local_1c8;
    local_488._0_3_ = CONCAT12(local_218._1_1_,(undefined2)local_488);
    local_488._0_4_ = CONCAT13(local_218._2_1_,(undefined3)local_488);
    local_488._0_5_ = CONCAT14(local_218._2_1_,(undefined4)local_488);
    local_488._0_6_ = CONCAT15(local_218._3_1_,(undefined5)local_488);
    local_488._0_7_ = CONCAT16(local_218._3_1_,(undefined6)local_488);
    local_488 = CONCAT17(local_218._4_1_,(undefined7)local_488);
    uStack_480._0_1_ = local_218._4_1_;
    uStack_480._1_1_ = local_218._5_1_;
    uStack_480._2_1_ = local_218._5_1_;
    uStack_480._3_1_ = local_218._6_1_;
    uStack_480._4_1_ = local_218._6_1_;
    uStack_480._5_1_ = local_218._7_1_;
    uStack_480._6_1_ = local_218._7_1_;
    uVar3 = local_488._8_7_;
    uStack_480 = (ulong)uVar3;
    local_1f8 = local_488;
    uStack_1f0 = uStack_480;
    local_208 = local_388;
    uStack_200 = uStack_380;
    auVar2._8_7_ = uVar3;
    auVar2._0_8_ = local_488;
    auVar2[0xf] = 0;
    auVar1._8_8_ = uStack_380;
    auVar1._0_8_ = local_388;
    pmaddubsw(auVar2,auVar1);
    v_val_w[1] = (longlong)in_RSI;
    v_val_w[0] = 7;
    local_218 = local_1c8;
    alVar4 = xx_roundn_epu16(v_val_w,(int)in_RDX);
    alVar4[0] = (longlong)in_RSI;
    xx_storel_32(local_370,alVar4);
  }
  if (local_30c != 0) {
    if (local_30c == 4) {
      for (local_320 = 0; local_320 < local_31c; local_320 = local_320 + 1) {
        xx_loadl_32(local_318);
        alVar4 = xx_loadl_32((void *)((long)local_318 + 4));
        v_01[1] = alVar4[1];
        local_2a8 = (undefined1)extraout_XMM0_Qa_00;
        uStack_2a7 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 8);
        uStack_2a6 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x10);
        uStack_2a5 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x18);
        uStack_2a4 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x20);
        uStack_2a3 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x28);
        uStack_2a2 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x30);
        uStack_2a1 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x38);
        uStack_2a0 = (undefined1)extraout_XMM0_Qb_00;
        uStack_29f = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 8);
        uStack_29e = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x10);
        uStack_29d = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x18);
        uStack_29c = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x20);
        uStack_29b = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x28);
        uStack_29a = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x30);
        uStack_299 = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x38);
        local_2b8 = (undefined1)extraout_XMM0_Qa_01;
        uStack_2b7 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 8);
        uStack_2b6 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x10);
        uStack_2b5 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x18);
        uStack_2b4 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x20);
        uStack_2b3 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x28);
        uStack_2b2 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x30);
        uStack_2b1 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x38);
        uStack_2b0 = (undefined1)extraout_XMM0_Qb_01;
        uStack_2af = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 8);
        uStack_2ae = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x10);
        uStack_2ad = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x18);
        uStack_2ac = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x20);
        uStack_2ab = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x28);
        uStack_2aa = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x30);
        uStack_2a9 = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x38);
        pavgb(local_2a8,local_2b8);
        pavgb(uStack_2a7,uStack_2b7);
        pavgb(uStack_2a6,uStack_2b6);
        pavgb(uStack_2a5,uStack_2b5);
        pavgb(uStack_2a4,uStack_2b4);
        pavgb(uStack_2a3,uStack_2b3);
        pavgb(uStack_2a2,uStack_2b2);
        pavgb(uStack_2a1,uStack_2b1);
        pavgb(uStack_2a0,uStack_2b0);
        pavgb(uStack_29f,uStack_2af);
        pavgb(uStack_29e,uStack_2ae);
        pavgb(uStack_29d,uStack_2ad);
        pavgb(uStack_29c,uStack_2ac);
        pavgb(uStack_29b,uStack_2ab);
        pavgb(uStack_29a,uStack_2aa);
        pavgb(uStack_299,uStack_2a9);
        v_01[0] = (longlong)in_RSI;
        xx_storel_32(local_318,v_01);
        local_318 = (undefined8 *)((long)local_318 + 4);
      }
    }
    else {
      local_26c = bilinear_filters_2t[local_30c];
      local_248 = CONCAT26(local_26c,CONCAT24(local_26c,CONCAT22(local_26c,local_26c)));
      uStack_240 = CONCAT26(local_26c,CONCAT24(local_26c,CONCAT22(local_26c,local_26c)));
      local_238 = local_26c;
      local_236 = local_26c;
      local_234 = local_26c;
      local_232 = local_26c;
      local_230 = local_26c;
      local_22e = local_26c;
      local_22c = local_26c;
      local_22a = local_26c;
      for (local_320 = 0; local_320 < local_31c; local_320 = local_320 + 4) {
        xx_loadl_32(local_318);
        xx_loadl_32((void *)((long)local_318 + 4));
        xx_loadl_32(local_318 + 1);
        xx_loadl_32((void *)((long)local_318 + 0xc));
        xx_loadl_32(local_318 + 2);
        local_c8 = (undefined4)extraout_XMM0_Qa_02;
        uStack_c4 = (undefined4)((ulong)extraout_XMM0_Qa_02 >> 0x20);
        local_e8 = (undefined4)extraout_XMM0_Qa_03;
        uStack_e4 = (undefined4)((ulong)extraout_XMM0_Qa_03 >> 0x20);
        local_108 = (undefined4)extraout_XMM0_Qa_04;
        uStack_104 = (undefined4)((ulong)extraout_XMM0_Qa_04 >> 0x20);
        filter_block_2rows((__m128i *)CONCAT44(local_c8,extraout_XMM0_Da),
                           (__m128i *)CONCAT44(uStack_e4,uStack_c4),
                           (__m128i *)CONCAT44(local_e8,local_c8),
                           (__m128i *)CONCAT44(uStack_104,uStack_e4),
                           (__m128i *)CONCAT44(local_108,local_e8));
        local_2e0 = local_318;
        *local_318 = extraout_XMM0_Qa_05;
        local_318[1] = extraout_XMM0_Qb_02;
        local_318 = local_318 + 2;
      }
    }
  }
  return;
}

Assistant:

static void bilinear_filter4xh(const uint8_t *src, int src_stride, int xoffset,
                               int yoffset, uint8_t *dst, int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = xx_loadl_32((__m128i *)src);
      xx_storel_32(b, x);
      src += src_stride;
      b += 4;
    }
  } else if (xoffset == 4) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 1);
      xx_storel_32(b, _mm_avg_epu8(x, z));
      src += src_stride;
      b += 4;
    }
  } else {
    uint8_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi16(hfilter[0] | (hfilter[1] << 8));
    for (i = 0; i < h; i += 4) {
      const __m128i x0 = _mm_loadl_epi64((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 1);
      const __m128i x1 = _mm_loadl_epi64((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 1);
      const __m128i x2 = _mm_loadl_epi64((__m128i *)&src[src_stride * 2]);
      const __m128i z2 = _mm_srli_si128(x2, 1);
      const __m128i x3 = _mm_loadl_epi64((__m128i *)&src[src_stride * 3]);
      const __m128i z3 = _mm_srli_si128(x3, 1);

      const __m128i a0 = _mm_unpacklo_epi32(x0, x1);
      const __m128i b0 = _mm_unpacklo_epi32(z0, z1);
      const __m128i a1 = _mm_unpacklo_epi32(x2, x3);
      const __m128i b1 = _mm_unpacklo_epi32(z2, z3);
      const __m128i res = filter_block_2rows(&a0, &b0, &a1, &b1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 4;
      b += 16;
    }
    // Handle i = h separately
    const __m128i x = _mm_loadl_epi64((__m128i *)src);
    const __m128i z = _mm_srli_si128(x, 1);

    __m128i v0 = _mm_unpacklo_epi8(x, z);
    v0 = _mm_maddubs_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu16(v0, FILTER_BITS);

    xx_storel_32(b, _mm_packus_epi16(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = xx_loadl_32((__m128i *)dst);
      __m128i y = xx_loadl_32((__m128i *)&dst[4]);
      xx_storel_32(dst, _mm_avg_epu8(x, y));
      dst += 4;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi16(vfilter[0] | (vfilter[1] << 8));
    for (i = 0; i < h; i += 4) {
      const __m128i a = xx_loadl_32((__m128i *)dst);
      const __m128i b = xx_loadl_32((__m128i *)&dst[4]);
      const __m128i c = xx_loadl_32((__m128i *)&dst[8]);
      const __m128i d = xx_loadl_32((__m128i *)&dst[12]);
      const __m128i e = xx_loadl_32((__m128i *)&dst[16]);

      const __m128i a0 = _mm_unpacklo_epi32(a, b);
      const __m128i b0 = _mm_unpacklo_epi32(b, c);
      const __m128i a1 = _mm_unpacklo_epi32(c, d);
      const __m128i b1 = _mm_unpacklo_epi32(d, e);
      const __m128i res = filter_block_2rows(&a0, &b0, &a1, &b1, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 16;
    }
  }
}